

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

wchar_t check_devices(object *obj)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  bool local_31;
  char *pcStack_30;
  _Bool activated;
  char *what;
  char *action;
  wchar_t fail;
  object *obj_local;
  
  pcStack_30 = (char *)0x0;
  local_31 = false;
  _Var1 = tval_is_rod(obj);
  if (_Var1) {
    what = "zap the rod";
  }
  else {
    _Var1 = tval_is_wand(obj);
    if (_Var1) {
      what = "use the wand";
      pcStack_30 = "wand";
    }
    else {
      _Var1 = tval_is_staff(obj);
      if (_Var1) {
        what = "use the staff";
        pcStack_30 = "staff";
      }
      else {
        what = "activate it";
      }
      local_31 = !_Var1;
    }
  }
  if ((pcStack_30 == (char *)0x0) || (0 < obj->pval)) {
    wVar2 = get_use_device_chance(obj);
    uVar3 = Rand_div(1000);
    if (uVar3 + L'\x01' < wVar2) {
      event_signal(EVENT_INPUT_FLUSH);
      msg("You failed to %s properly.",what);
      obj_local._4_4_ = L'\xffffffff';
      if (wVar2 < L'ϩ') {
        obj_local._4_4_ = L'\0';
      }
    }
    else {
      if (local_31) {
        if (obj->effect == (effect *)0x0) {
          if (obj->activation != (activation *)0x0) {
            obj->known->activation = obj->activation;
          }
        }
        else {
          obj->known->effect = obj->effect;
        }
      }
      obj_local._4_4_ = L'\x01';
    }
  }
  else {
    event_signal(EVENT_INPUT_FLUSH);
    msg("The %s has no charges left.",pcStack_30);
    obj_local._4_4_ = L'\xffffffff';
  }
  return obj_local._4_4_;
}

Assistant:

static int check_devices(struct object *obj)
{
	int fail;
	const char *action;
	const char *what = NULL;
	bool activated = false;

	/* Get the right string */
	if (tval_is_rod(obj)) {
		action = "zap the rod";
	} else if (tval_is_wand(obj)) {
		action = "use the wand";
		what = "wand";
	} else if (tval_is_staff(obj)) {
		action = "use the staff";
		what = "staff";
	} else {
		action = "activate it";
		activated = true;
	}

	/* Notice empty staffs */
	if (what && obj->pval <= 0) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("The %s has no charges left.", what);
		return -1;
	}

	/* Figure out how hard the item is to use */
	fail = get_use_device_chance(obj);

	/* Roll for usage */
	if (randint1(1000) < fail) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to %s properly.", action);
		return (fail < 1001) ? 0 : -1;
	}

	/* Notice activations */
	if (activated) {
		if (obj->effect)
			obj->known->effect = obj->effect;
		else if (obj->activation)
			obj->known->activation = obj->activation;
	}

	return 1;
}